

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal_replay.cpp
# Opt level: O3

void __thiscall
duckdb::WriteAheadLogDeserializer::ReplayCreateSchema(WriteAheadLogDeserializer *this)

{
  BinaryDeserializer *pBVar1;
  CreateSchemaInfo info;
  undefined1 *local_158 [2];
  undefined1 local_148 [16];
  undefined1 local_138 [296];
  
  CreateSchemaInfo::CreateSchemaInfo((CreateSchemaInfo *)local_138);
  pBVar1 = &this->deserializer;
  (*(this->deserializer).super_Deserializer._vptr_Deserializer[2])(pBVar1,0x65,"schema");
  (*(pBVar1->super_Deserializer)._vptr_Deserializer[0x1a])(local_158,pBVar1);
  (*(pBVar1->super_Deserializer)._vptr_Deserializer[3])(pBVar1);
  ::std::__cxx11::string::operator=((string *)(local_138 + 0x30),(string *)local_158);
  if (local_158[0] != local_148) {
    operator_delete(local_158[0]);
  }
  if (this->deserialize_only == false) {
    Catalog::CreateSchema(this->catalog,this->context,(CreateSchemaInfo *)local_138);
  }
  CreateInfo::~CreateInfo((CreateInfo *)local_138);
  return;
}

Assistant:

void WriteAheadLogDeserializer::ReplayCreateSchema() {
	CreateSchemaInfo info;
	info.schema = deserializer.ReadProperty<string>(101, "schema");
	if (DeserializeOnly()) {
		return;
	}

	catalog.CreateSchema(context, info);
}